

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

ssize_t __thiscall google::LogSink::send(LogSink *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ssize_t in_RAX;
  
  return in_RAX;
}

Assistant:

void LogSink::send(LogSeverity severity, const char* full_filename,
                   const char* base_filename, int line, const std::tm* t,
                   const char* message, size_t message_len) {
  (void)severity;
  (void)full_filename;
  (void)base_filename;
  (void)line;
  (void)t;
  (void)message;
  (void)message_len;
}